

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool duckdb_je_arena_init_huge(arena_t *a0)

{
  ulong uVar1;
  
  uVar1 = duckdb_je_opt_oversize_threshold - 0x4000;
  if (uVar1 < 0x6fffffffffffc001) {
    huge_arena_ind = duckdb_je_narenas_total_get();
    duckdb_je_oversize_threshold = duckdb_je_opt_oversize_threshold;
    (a0->pa_shard).pac.duckdb_je_oversize_threshold.repr = duckdb_je_opt_oversize_threshold;
  }
  else {
    duckdb_je_opt_oversize_threshold = 0;
    duckdb_je_oversize_threshold = 0x7000000000001000;
  }
  return uVar1 < 0x6fffffffffffc001;
}

Assistant:

bool
arena_init_huge(arena_t *a0) {
	bool huge_enabled;

	/* The threshold should be large size class. */
	if (opt_oversize_threshold > SC_LARGE_MAXCLASS ||
	    opt_oversize_threshold < SC_LARGE_MINCLASS) {
		opt_oversize_threshold = 0;
		oversize_threshold = SC_LARGE_MAXCLASS + PAGE;
		huge_enabled = false;
	} else {
		/* Reserve the index for the huge arena. */
		huge_arena_ind = narenas_total_get();
		oversize_threshold = opt_oversize_threshold;
		/* a0 init happened before malloc_conf_init. */
		atomic_store_zu(&a0->pa_shard.pac.oversize_threshold,
		    oversize_threshold, ATOMIC_RELAXED);
		huge_enabled = true;
	}

	return huge_enabled;
}